

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bond.cpp
# Opt level: O3

String * __thiscall indigox::Bond::ToString_abi_cxx11_(String *__return_storage_ptr__,Bond *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Atom *pAVar3;
  _Atomic_word _Var4;
  ostream *poVar5;
  bool bVar6;
  stringstream ss;
  String local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Bond(",5);
  p_Var2 = (this->atoms_)._M_elems[0].super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) || (p_Var2->_M_use_count == 0)
     ) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\"None\"",6);
  }
  else {
    _Var4 = p_Var2->_M_use_count;
    do {
      LOCK();
      iVar1 = p_Var2->_M_use_count;
      bVar6 = _Var4 == iVar1;
      if (bVar6) {
        p_Var2->_M_use_count = _Var4 + 1;
        iVar1 = _Var4;
      }
      _Var4 = iVar1;
      UNLOCK();
    } while (!bVar6);
    pAVar3 = (this->atoms_)._M_elems[0].super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    Atom::GetIndex(pAVar3);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":\"",2);
    Atom::GetName_abi_cxx11_(&local_1d8,pAVar3);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
  p_Var2 = (this->atoms_)._M_elems[1].super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) || (p_Var2->_M_use_count == 0)
     ) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\"None\"",6);
  }
  else {
    _Var4 = p_Var2->_M_use_count;
    do {
      LOCK();
      iVar1 = p_Var2->_M_use_count;
      bVar6 = _Var4 == iVar1;
      if (bVar6) {
        p_Var2->_M_use_count = _Var4 + 1;
        iVar1 = _Var4;
      }
      _Var4 = iVar1;
      UNLOCK();
    } while (!bVar6);
    pAVar3 = (this->atoms_)._M_elems[1].super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    Atom::GetIndex(pAVar3);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":\"",2);
    Atom::GetName_abi_cxx11_(&local_1d8,pAVar3);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

String Bond::ToString() const {
    std::stringstream ss;
    ss << "Bond(";
    if (!atoms_[0].expired()) {
      Atom_p tmp = atoms_[0].lock();
      ss << tmp->GetIndex() << ":\"" << tmp->GetName() << "\"";
    } else {
      ss << "\"None\"";
    }
    ss << ",";
    if (!atoms_[1].expired()) {
      Atom_p tmp = atoms_[1].lock();
      ss << tmp->GetIndex() << ":\"" << tmp->GetName() << "\"";
    } else {
      ss << "\"None\"";
    }
    ss << ")";
    return ss.str();
  }